

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O3

Bond_p __thiscall indigox::Molecule::GetBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *this_00;
  AtomBondIterator AVar3;
  AtomBondIterator AVar4;
  long *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  bool bVar6;
  Molecule_p MVar7;
  Atom_p AVar8;
  Bond_p BVar9;
  undefined1 local_50 [24];
  element_type *local_38;
  
  MVar7 = Atom::GetMolecule((Atom *)local_50);
  _Var5 = MVar7.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar1 = *(element_type **)local_50._0_8_;
  peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    _Var5._M_pi = extraout_RDX;
  }
  if (peVar1 == peVar2) {
    MVar7 = Atom::GetMolecule((Atom *)local_50);
    _Var5 = MVar7.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    peVar1 = *(element_type **)local_50._0_8_;
    peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      _Var5._M_pi = extraout_RDX_00;
    }
    if (peVar1 == peVar2) {
      AVar3 = Atom::BeginBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
      AVar4 = Atom::EndBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
      _Var5._M_pi = extraout_RDX_01;
      if (AVar3._M_current != AVar4._M_current) {
        do {
          std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,
                     AVar3._M_current);
          AVar8 = Bond::GetSourceAtom((Bond *)local_50);
          _Var5 = AVar8.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if ((element_type *)local_50._0_8_ ==
              (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
            AVar8 = Bond::GetTargetAtom((Bond *)(local_50 + 0x10));
            _Var5 = AVar8.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
            bVar6 = (element_type *)local_50._16_8_ == (element_type *)*in_RCX;
            if (local_38 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
              _Var5._M_pi = extraout_RDX_02;
            }
          }
          else {
            bVar6 = false;
          }
          if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            _Var5._M_pi = extraout_RDX_03;
          }
          if (bVar6) goto LAB_0010aac3;
          AVar8 = Bond::GetSourceAtom((Bond *)local_50);
          _Var5 = AVar8.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if ((element_type *)local_50._0_8_ == (element_type *)*in_RCX) {
            AVar8 = Bond::GetTargetAtom((Bond *)(local_50 + 0x10));
            _Var5 = AVar8.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
            bVar6 = (element_type *)local_50._16_8_ ==
                    (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if (local_38 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
              _Var5._M_pi = extraout_RDX_04;
            }
          }
          else {
            bVar6 = false;
          }
          if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            _Var5._M_pi = extraout_RDX_05;
          }
          if (bVar6) goto LAB_0010aac3;
          this_00 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                    super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          AVar3._M_current = AVar3._M_current + 1;
          AVar4 = Atom::EndBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
          _Var5._M_pi = extraout_RDX_06;
        } while (AVar3._M_current != AVar4._M_current);
      }
    }
  }
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0010aac3:
  BVar9.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar9.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Bond_p)BVar9.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBond(Atom_p a, Atom_p b) const {
  /// @todo Logging system calls for fail reasons
  Bond_p bnd = Bond_p();
  if (a->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  if (b->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  for (AtomBondIterator it = a->BeginBond(); it != a->EndBond(); ++it) {
    Bond_p tmp = it->lock();
    if (tmp->GetSourceAtom() == a && tmp->GetTargetAtom() == b) return tmp;
    if (tmp->GetSourceAtom() == b && tmp->GetTargetAtom() == a) return tmp;
  }
  return bnd;
}